

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O0

CtxItem * __thiscall di::Context::getItem<T4_B>(Context *this)

{
  bool bVar1;
  pointer ppVar2;
  type_index *this_00;
  bool local_59;
  type_index local_48;
  CtxItem *local_40;
  CtxItem *item;
  _Base_ptr local_30;
  _Self local_28;
  type_index local_20;
  _Self local_18;
  iterator it;
  Context *this_local;
  
  it._M_node = (_Base_ptr)this;
  std::type_index::type_index(&local_20,(type_info *)&T4_B::typeinfo);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::type_index,_di::Context::CtxItem,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
       ::find(&this->items,&local_20);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::type_index,_di::Context::CtxItem,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
       ::end(&this->items);
  bVar1 = std::operator==(&local_18,&local_28);
  if (bVar1) {
    addClassAuto<T4_B,_nullptr>(this,(void *)0x0);
    std::type_index::type_index((type_index *)&item,(type_info *)&T4_B::typeinfo);
    local_30 = (_Base_ptr)
               std::
               map<std::type_index,_di::Context::CtxItem,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
               ::find(&this->items,(key_type *)&item);
    local_18._M_node = local_30;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_std::type_index,_di::Context::CtxItem>_>::
             operator->(&local_18);
    local_40 = &ppVar2->second;
    local_59 = false;
    if (local_40->instancePtr == (void *)0x0) {
      bVar1 = std::function::operator_cast_to_bool((function *)&(ppVar2->second).factory);
      local_59 = false;
      if (!bVar1) {
        this_00 = &local_40->derivedType;
        std::type_index::type_index(&local_48,(type_info *)&void::typeinfo);
        local_59 = std::type_index::operator!=(this_00,&local_48);
      }
    }
    if (local_59 != false) {
      local_18._M_node =
           (_Base_ptr)
           std::
           map<std::type_index,_di::Context::CtxItem,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
           ::find(&this->items,&local_40->derivedType);
    }
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_std::type_index,_di::Context::CtxItem>_>::
           operator->(&local_18);
  return &ppVar2->second;
}

Assistant:

CtxItem& getItem()
    {
        auto it = items.find( std::type_index(typeid(T)) );

        if (it == items.end())
        {
            addClassAuto<T>(nullptr);
            it = items.find( std::type_index(typeid(T)) );
        }
        else
        {
            CtxItem& item = it->second;

            // fallback to derived type (no instance or factory, but a derived type is registered)
            if ( !item.instancePtr && !item.factory && (item.derivedType != std::type_index(typeid(void))) )
                it = items.find(item.derivedType);
        }

        return it->second;
    }